

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

string * __thiscall
Lib::Exception::toString<char_const*,std::__cxx11::string,char_const*>
          (Exception *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_1,char *msg_2)

{
  string *in_RCX;
  string *in_RDI;
  stringstream out;
  string local_1d0 [8];
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  ostream *in_stack_fffffffffffffe50;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe50);
  std::__cxx11::string::string(local_1d0,in_RCX);
  OutputAll<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::apply(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
          in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe50);
  return in_RDI;
}

Assistant:

std::string toString(Msg... msg){
    std::stringstream out;
    OutputAll<Msg...>::apply(out, msg...);
    return out.str();
  }